

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_vulkan.c
# Opt level: O2

int gladLoadVulkanUserPtr(VkPhysicalDevice physical_device,GLADuserptrloadfunc load,void *userptr)

{
  VkResult VVar1;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  VkExtensionProperties *pVVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t i;
  VkPhysicalDevice pVVar10;
  uint32_t instance_extension_count;
  uint32_t device_extension_count;
  VkExtensionProperties *local_3a0;
  uint local_394;
  VkExtensionProperties *local_390;
  ulong local_388;
  VkPhysicalDevice local_380;
  int local_374;
  ulong local_370;
  uint32_t version;
  
  glad_vkEnumerateInstanceVersion =
       (PFN_vkEnumerateInstanceVersion)(*load)("vkEnumerateInstanceVersion",userptr);
  if (glad_vkEnumerateInstanceVersion == (PFN_vkEnumerateInstanceVersion)0x0) {
    uVar5 = 0;
    uVar2 = 1;
  }
  else {
    VVar1 = (*glad_vkEnumerateInstanceVersion)(&version);
    uVar5 = 0;
    if (VVar1 == VK_SUCCESS) {
      uVar5 = version >> 0xc & 0x3ff;
    }
    uVar2 = 1;
    if (VVar1 == VK_SUCCESS) {
      uVar2 = version >> 0x16;
    }
  }
  if (glad_vkGetPhysicalDeviceProperties != (PFN_vkGetPhysicalDeviceProperties)0x0 &&
      physical_device != (VkPhysicalDevice)0x0) {
    (*glad_vkGetPhysicalDeviceProperties)(physical_device,(VkPhysicalDeviceProperties *)&version);
    uVar2 = version >> 0x16;
    uVar5 = version >> 0xc & 0x3ff;
  }
  GLAD_VK_VERSION_1_1 = (int)(1 < uVar2);
  GLAD_VK_VERSION_1_0 = (int)(1 < uVar2);
  if (uVar2 == 1) {
    GLAD_VK_VERSION_1_0 = 1;
  }
  if (uVar5 != 0) {
    GLAD_VK_VERSION_1_1 = GLAD_VK_VERSION_1_0;
  }
  iVar6 = uVar2 * 10000 + uVar5;
  if (iVar6 == 0) {
    return 0;
  }
  if (GLAD_VK_VERSION_1_0 != 0) {
    glad_vkAllocateCommandBuffers =
         (PFN_vkAllocateCommandBuffers)(*load)("vkAllocateCommandBuffers",userptr);
    glad_vkAllocateDescriptorSets =
         (PFN_vkAllocateDescriptorSets)(*load)("vkAllocateDescriptorSets",userptr);
    glad_vkAllocateMemory = (PFN_vkAllocateMemory)(*load)("vkAllocateMemory",userptr);
    glad_vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)(*load)("vkBeginCommandBuffer",userptr);
    glad_vkBindBufferMemory = (PFN_vkBindBufferMemory)(*load)("vkBindBufferMemory",userptr);
    glad_vkBindImageMemory = (PFN_vkBindImageMemory)(*load)("vkBindImageMemory",userptr);
    glad_vkCmdBeginQuery = (PFN_vkCmdBeginQuery)(*load)("vkCmdBeginQuery",userptr);
    glad_vkCmdBeginRenderPass = (PFN_vkCmdBeginRenderPass)(*load)("vkCmdBeginRenderPass",userptr);
    glad_vkCmdBindDescriptorSets =
         (PFN_vkCmdBindDescriptorSets)(*load)("vkCmdBindDescriptorSets",userptr);
    glad_vkCmdBindIndexBuffer = (PFN_vkCmdBindIndexBuffer)(*load)("vkCmdBindIndexBuffer",userptr);
    glad_vkCmdBindPipeline = (PFN_vkCmdBindPipeline)(*load)("vkCmdBindPipeline",userptr);
    glad_vkCmdBindVertexBuffers =
         (PFN_vkCmdBindVertexBuffers)(*load)("vkCmdBindVertexBuffers",userptr);
    glad_vkCmdBlitImage = (PFN_vkCmdBlitImage)(*load)("vkCmdBlitImage",userptr);
    glad_vkCmdClearAttachments = (PFN_vkCmdClearAttachments)(*load)("vkCmdClearAttachments",userptr)
    ;
    glad_vkCmdClearColorImage = (PFN_vkCmdClearColorImage)(*load)("vkCmdClearColorImage",userptr);
    glad_vkCmdClearDepthStencilImage =
         (PFN_vkCmdClearDepthStencilImage)(*load)("vkCmdClearDepthStencilImage",userptr);
    glad_vkCmdCopyBuffer = (PFN_vkCmdCopyBuffer)(*load)("vkCmdCopyBuffer",userptr);
    glad_vkCmdCopyBufferToImage =
         (PFN_vkCmdCopyBufferToImage)(*load)("vkCmdCopyBufferToImage",userptr);
    glad_vkCmdCopyImage = (PFN_vkCmdCopyImage)(*load)("vkCmdCopyImage",userptr);
    glad_vkCmdCopyImageToBuffer =
         (PFN_vkCmdCopyImageToBuffer)(*load)("vkCmdCopyImageToBuffer",userptr);
    glad_vkCmdCopyQueryPoolResults =
         (PFN_vkCmdCopyQueryPoolResults)(*load)("vkCmdCopyQueryPoolResults",userptr);
    glad_vkCmdDispatch = (PFN_vkCmdDispatch)(*load)("vkCmdDispatch",userptr);
    glad_vkCmdDispatchIndirect = (PFN_vkCmdDispatchIndirect)(*load)("vkCmdDispatchIndirect",userptr)
    ;
    glad_vkCmdDraw = (PFN_vkCmdDraw)(*load)("vkCmdDraw",userptr);
    glad_vkCmdDrawIndexed = (PFN_vkCmdDrawIndexed)(*load)("vkCmdDrawIndexed",userptr);
    glad_vkCmdDrawIndexedIndirect =
         (PFN_vkCmdDrawIndexedIndirect)(*load)("vkCmdDrawIndexedIndirect",userptr);
    glad_vkCmdDrawIndirect = (PFN_vkCmdDrawIndirect)(*load)("vkCmdDrawIndirect",userptr);
    glad_vkCmdEndQuery = (PFN_vkCmdEndQuery)(*load)("vkCmdEndQuery",userptr);
    glad_vkCmdEndRenderPass = (PFN_vkCmdEndRenderPass)(*load)("vkCmdEndRenderPass",userptr);
    glad_vkCmdExecuteCommands = (PFN_vkCmdExecuteCommands)(*load)("vkCmdExecuteCommands",userptr);
    glad_vkCmdFillBuffer = (PFN_vkCmdFillBuffer)(*load)("vkCmdFillBuffer",userptr);
    glad_vkCmdNextSubpass = (PFN_vkCmdNextSubpass)(*load)("vkCmdNextSubpass",userptr);
    glad_vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)(*load)("vkCmdPipelineBarrier",userptr);
    glad_vkCmdPushConstants = (PFN_vkCmdPushConstants)(*load)("vkCmdPushConstants",userptr);
    glad_vkCmdResetEvent = (PFN_vkCmdResetEvent)(*load)("vkCmdResetEvent",userptr);
    glad_vkCmdResetQueryPool = (PFN_vkCmdResetQueryPool)(*load)("vkCmdResetQueryPool",userptr);
    glad_vkCmdResolveImage = (PFN_vkCmdResolveImage)(*load)("vkCmdResolveImage",userptr);
    glad_vkCmdSetBlendConstants =
         (PFN_vkCmdSetBlendConstants)(*load)("vkCmdSetBlendConstants",userptr);
    glad_vkCmdSetDepthBias = (PFN_vkCmdSetDepthBias)(*load)("vkCmdSetDepthBias",userptr);
    glad_vkCmdSetDepthBounds = (PFN_vkCmdSetDepthBounds)(*load)("vkCmdSetDepthBounds",userptr);
    glad_vkCmdSetEvent = (PFN_vkCmdSetEvent)(*load)("vkCmdSetEvent",userptr);
    glad_vkCmdSetLineWidth = (PFN_vkCmdSetLineWidth)(*load)("vkCmdSetLineWidth",userptr);
    glad_vkCmdSetScissor = (PFN_vkCmdSetScissor)(*load)("vkCmdSetScissor",userptr);
    glad_vkCmdSetStencilCompareMask =
         (PFN_vkCmdSetStencilCompareMask)(*load)("vkCmdSetStencilCompareMask",userptr);
    glad_vkCmdSetStencilReference =
         (PFN_vkCmdSetStencilReference)(*load)("vkCmdSetStencilReference",userptr);
    glad_vkCmdSetStencilWriteMask =
         (PFN_vkCmdSetStencilWriteMask)(*load)("vkCmdSetStencilWriteMask",userptr);
    glad_vkCmdSetViewport = (PFN_vkCmdSetViewport)(*load)("vkCmdSetViewport",userptr);
    glad_vkCmdUpdateBuffer = (PFN_vkCmdUpdateBuffer)(*load)("vkCmdUpdateBuffer",userptr);
    glad_vkCmdWaitEvents = (PFN_vkCmdWaitEvents)(*load)("vkCmdWaitEvents",userptr);
    glad_vkCmdWriteTimestamp = (PFN_vkCmdWriteTimestamp)(*load)("vkCmdWriteTimestamp",userptr);
    glad_vkCreateBuffer = (PFN_vkCreateBuffer)(*load)("vkCreateBuffer",userptr);
    glad_vkCreateBufferView = (PFN_vkCreateBufferView)(*load)("vkCreateBufferView",userptr);
    glad_vkCreateCommandPool = (PFN_vkCreateCommandPool)(*load)("vkCreateCommandPool",userptr);
    glad_vkCreateComputePipelines =
         (PFN_vkCreateComputePipelines)(*load)("vkCreateComputePipelines",userptr);
    glad_vkCreateDescriptorPool =
         (PFN_vkCreateDescriptorPool)(*load)("vkCreateDescriptorPool",userptr);
    glad_vkCreateDescriptorSetLayout =
         (PFN_vkCreateDescriptorSetLayout)(*load)("vkCreateDescriptorSetLayout",userptr);
    glad_vkCreateDevice = (PFN_vkCreateDevice)(*load)("vkCreateDevice",userptr);
    glad_vkCreateEvent = (PFN_vkCreateEvent)(*load)("vkCreateEvent",userptr);
    glad_vkCreateFence = (PFN_vkCreateFence)(*load)("vkCreateFence",userptr);
    glad_vkCreateFramebuffer = (PFN_vkCreateFramebuffer)(*load)("vkCreateFramebuffer",userptr);
    glad_vkCreateGraphicsPipelines =
         (PFN_vkCreateGraphicsPipelines)(*load)("vkCreateGraphicsPipelines",userptr);
    glad_vkCreateImage = (PFN_vkCreateImage)(*load)("vkCreateImage",userptr);
    glad_vkCreateImageView = (PFN_vkCreateImageView)(*load)("vkCreateImageView",userptr);
    glad_vkCreateInstance = (PFN_vkCreateInstance)(*load)("vkCreateInstance",userptr);
    glad_vkCreatePipelineCache = (PFN_vkCreatePipelineCache)(*load)("vkCreatePipelineCache",userptr)
    ;
    glad_vkCreatePipelineLayout =
         (PFN_vkCreatePipelineLayout)(*load)("vkCreatePipelineLayout",userptr);
    glad_vkCreateQueryPool = (PFN_vkCreateQueryPool)(*load)("vkCreateQueryPool",userptr);
    glad_vkCreateRenderPass = (PFN_vkCreateRenderPass)(*load)("vkCreateRenderPass",userptr);
    glad_vkCreateSampler = (PFN_vkCreateSampler)(*load)("vkCreateSampler",userptr);
    glad_vkCreateSemaphore = (PFN_vkCreateSemaphore)(*load)("vkCreateSemaphore",userptr);
    glad_vkCreateShaderModule = (PFN_vkCreateShaderModule)(*load)("vkCreateShaderModule",userptr);
    glad_vkDestroyBuffer = (PFN_vkDestroyBuffer)(*load)("vkDestroyBuffer",userptr);
    glad_vkDestroyBufferView = (PFN_vkDestroyBufferView)(*load)("vkDestroyBufferView",userptr);
    glad_vkDestroyCommandPool = (PFN_vkDestroyCommandPool)(*load)("vkDestroyCommandPool",userptr);
    glad_vkDestroyDescriptorPool =
         (PFN_vkDestroyDescriptorPool)(*load)("vkDestroyDescriptorPool",userptr);
    glad_vkDestroyDescriptorSetLayout =
         (PFN_vkDestroyDescriptorSetLayout)(*load)("vkDestroyDescriptorSetLayout",userptr);
    glad_vkDestroyDevice = (PFN_vkDestroyDevice)(*load)("vkDestroyDevice",userptr);
    glad_vkDestroyEvent = (PFN_vkDestroyEvent)(*load)("vkDestroyEvent",userptr);
    glad_vkDestroyFence = (PFN_vkDestroyFence)(*load)("vkDestroyFence",userptr);
    glad_vkDestroyFramebuffer = (PFN_vkDestroyFramebuffer)(*load)("vkDestroyFramebuffer",userptr);
    glad_vkDestroyImage = (PFN_vkDestroyImage)(*load)("vkDestroyImage",userptr);
    glad_vkDestroyImageView = (PFN_vkDestroyImageView)(*load)("vkDestroyImageView",userptr);
    glad_vkDestroyInstance = (PFN_vkDestroyInstance)(*load)("vkDestroyInstance",userptr);
    glad_vkDestroyPipeline = (PFN_vkDestroyPipeline)(*load)("vkDestroyPipeline",userptr);
    glad_vkDestroyPipelineCache =
         (PFN_vkDestroyPipelineCache)(*load)("vkDestroyPipelineCache",userptr);
    glad_vkDestroyPipelineLayout =
         (PFN_vkDestroyPipelineLayout)(*load)("vkDestroyPipelineLayout",userptr);
    glad_vkDestroyQueryPool = (PFN_vkDestroyQueryPool)(*load)("vkDestroyQueryPool",userptr);
    glad_vkDestroyRenderPass = (PFN_vkDestroyRenderPass)(*load)("vkDestroyRenderPass",userptr);
    glad_vkDestroySampler = (PFN_vkDestroySampler)(*load)("vkDestroySampler",userptr);
    glad_vkDestroySemaphore = (PFN_vkDestroySemaphore)(*load)("vkDestroySemaphore",userptr);
    glad_vkDestroyShaderModule = (PFN_vkDestroyShaderModule)(*load)("vkDestroyShaderModule",userptr)
    ;
    glad_vkDeviceWaitIdle = (PFN_vkDeviceWaitIdle)(*load)("vkDeviceWaitIdle",userptr);
    glad_vkEndCommandBuffer = (PFN_vkEndCommandBuffer)(*load)("vkEndCommandBuffer",userptr);
    glad_vkEnumerateDeviceExtensionProperties =
         (PFN_vkEnumerateDeviceExtensionProperties)
         (*load)("vkEnumerateDeviceExtensionProperties",userptr);
    glad_vkEnumerateDeviceLayerProperties =
         (PFN_vkEnumerateDeviceLayerProperties)(*load)("vkEnumerateDeviceLayerProperties",userptr);
    glad_vkEnumerateInstanceExtensionProperties =
         (PFN_vkEnumerateInstanceExtensionProperties)
         (*load)("vkEnumerateInstanceExtensionProperties",userptr);
    glad_vkEnumerateInstanceLayerProperties =
         (PFN_vkEnumerateInstanceLayerProperties)
         (*load)("vkEnumerateInstanceLayerProperties",userptr);
    glad_vkEnumeratePhysicalDevices =
         (PFN_vkEnumeratePhysicalDevices)(*load)("vkEnumeratePhysicalDevices",userptr);
    glad_vkFlushMappedMemoryRanges =
         (PFN_vkFlushMappedMemoryRanges)(*load)("vkFlushMappedMemoryRanges",userptr);
    glad_vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)(*load)("vkFreeCommandBuffers",userptr);
    glad_vkFreeDescriptorSets = (PFN_vkFreeDescriptorSets)(*load)("vkFreeDescriptorSets",userptr);
    glad_vkFreeMemory = (PFN_vkFreeMemory)(*load)("vkFreeMemory",userptr);
    glad_vkGetBufferMemoryRequirements =
         (PFN_vkGetBufferMemoryRequirements)(*load)("vkGetBufferMemoryRequirements",userptr);
    glad_vkGetDeviceMemoryCommitment =
         (PFN_vkGetDeviceMemoryCommitment)(*load)("vkGetDeviceMemoryCommitment",userptr);
    glad_vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)(*load)("vkGetDeviceProcAddr",userptr);
    glad_vkGetDeviceQueue = (PFN_vkGetDeviceQueue)(*load)("vkGetDeviceQueue",userptr);
    glad_vkGetEventStatus = (PFN_vkGetEventStatus)(*load)("vkGetEventStatus",userptr);
    glad_vkGetFenceStatus = (PFN_vkGetFenceStatus)(*load)("vkGetFenceStatus",userptr);
    glad_vkGetImageMemoryRequirements =
         (PFN_vkGetImageMemoryRequirements)(*load)("vkGetImageMemoryRequirements",userptr);
    glad_vkGetImageSparseMemoryRequirements =
         (PFN_vkGetImageSparseMemoryRequirements)
         (*load)("vkGetImageSparseMemoryRequirements",userptr);
    glad_vkGetImageSubresourceLayout =
         (PFN_vkGetImageSubresourceLayout)(*load)("vkGetImageSubresourceLayout",userptr);
    glad_vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)(*load)("vkGetInstanceProcAddr",userptr)
    ;
    glad_vkGetPhysicalDeviceFeatures =
         (PFN_vkGetPhysicalDeviceFeatures)(*load)("vkGetPhysicalDeviceFeatures",userptr);
    glad_vkGetPhysicalDeviceFormatProperties =
         (PFN_vkGetPhysicalDeviceFormatProperties)
         (*load)("vkGetPhysicalDeviceFormatProperties",userptr);
    glad_vkGetPhysicalDeviceImageFormatProperties =
         (PFN_vkGetPhysicalDeviceImageFormatProperties)
         (*load)("vkGetPhysicalDeviceImageFormatProperties",userptr);
    glad_vkGetPhysicalDeviceMemoryProperties =
         (PFN_vkGetPhysicalDeviceMemoryProperties)
         (*load)("vkGetPhysicalDeviceMemoryProperties",userptr);
    glad_vkGetPhysicalDeviceProperties =
         (PFN_vkGetPhysicalDeviceProperties)(*load)("vkGetPhysicalDeviceProperties",userptr);
    glad_vkGetPhysicalDeviceQueueFamilyProperties =
         (PFN_vkGetPhysicalDeviceQueueFamilyProperties)
         (*load)("vkGetPhysicalDeviceQueueFamilyProperties",userptr);
    glad_vkGetPhysicalDeviceSparseImageFormatProperties =
         (PFN_vkGetPhysicalDeviceSparseImageFormatProperties)
         (*load)("vkGetPhysicalDeviceSparseImageFormatProperties",userptr);
    glad_vkGetPipelineCacheData =
         (PFN_vkGetPipelineCacheData)(*load)("vkGetPipelineCacheData",userptr);
    glad_vkGetQueryPoolResults = (PFN_vkGetQueryPoolResults)(*load)("vkGetQueryPoolResults",userptr)
    ;
    glad_vkGetRenderAreaGranularity =
         (PFN_vkGetRenderAreaGranularity)(*load)("vkGetRenderAreaGranularity",userptr);
    glad_vkInvalidateMappedMemoryRanges =
         (PFN_vkInvalidateMappedMemoryRanges)(*load)("vkInvalidateMappedMemoryRanges",userptr);
    glad_vkMapMemory = (PFN_vkMapMemory)(*load)("vkMapMemory",userptr);
    glad_vkMergePipelineCaches = (PFN_vkMergePipelineCaches)(*load)("vkMergePipelineCaches",userptr)
    ;
    glad_vkQueueBindSparse = (PFN_vkQueueBindSparse)(*load)("vkQueueBindSparse",userptr);
    glad_vkQueueSubmit = (PFN_vkQueueSubmit)(*load)("vkQueueSubmit",userptr);
    glad_vkQueueWaitIdle = (PFN_vkQueueWaitIdle)(*load)("vkQueueWaitIdle",userptr);
    glad_vkResetCommandBuffer = (PFN_vkResetCommandBuffer)(*load)("vkResetCommandBuffer",userptr);
    glad_vkResetCommandPool = (PFN_vkResetCommandPool)(*load)("vkResetCommandPool",userptr);
    glad_vkResetDescriptorPool = (PFN_vkResetDescriptorPool)(*load)("vkResetDescriptorPool",userptr)
    ;
    glad_vkResetEvent = (PFN_vkResetEvent)(*load)("vkResetEvent",userptr);
    glad_vkResetFences = (PFN_vkResetFences)(*load)("vkResetFences",userptr);
    glad_vkSetEvent = (PFN_vkSetEvent)(*load)("vkSetEvent",userptr);
    glad_vkUnmapMemory = (PFN_vkUnmapMemory)(*load)("vkUnmapMemory",userptr);
    glad_vkUpdateDescriptorSets =
         (PFN_vkUpdateDescriptorSets)(*load)("vkUpdateDescriptorSets",userptr);
    glad_vkWaitForFences = (PFN_vkWaitForFences)(*load)("vkWaitForFences",userptr);
  }
  if (GLAD_VK_VERSION_1_1 != 0) {
    glad_vkBindBufferMemory2 = (PFN_vkBindBufferMemory2)(*load)("vkBindBufferMemory2",userptr);
    glad_vkBindImageMemory2 = (PFN_vkBindImageMemory2)(*load)("vkBindImageMemory2",userptr);
    glad_vkCmdDispatchBase = (PFN_vkCmdDispatchBase)(*load)("vkCmdDispatchBase",userptr);
    glad_vkCmdSetDeviceMask = (PFN_vkCmdSetDeviceMask)(*load)("vkCmdSetDeviceMask",userptr);
    glad_vkCreateDescriptorUpdateTemplate =
         (PFN_vkCreateDescriptorUpdateTemplate)(*load)("vkCreateDescriptorUpdateTemplate",userptr);
    glad_vkCreateSamplerYcbcrConversion =
         (PFN_vkCreateSamplerYcbcrConversion)(*load)("vkCreateSamplerYcbcrConversion",userptr);
    glad_vkDestroyDescriptorUpdateTemplate =
         (PFN_vkDestroyDescriptorUpdateTemplate)(*load)("vkDestroyDescriptorUpdateTemplate",userptr)
    ;
    glad_vkDestroySamplerYcbcrConversion =
         (PFN_vkDestroySamplerYcbcrConversion)(*load)("vkDestroySamplerYcbcrConversion",userptr);
    glad_vkEnumerateInstanceVersion =
         (PFN_vkEnumerateInstanceVersion)(*load)("vkEnumerateInstanceVersion",userptr);
    glad_vkEnumeratePhysicalDeviceGroups =
         (PFN_vkEnumeratePhysicalDeviceGroups)(*load)("vkEnumeratePhysicalDeviceGroups",userptr);
    glad_vkGetBufferMemoryRequirements2 =
         (PFN_vkGetBufferMemoryRequirements2)(*load)("vkGetBufferMemoryRequirements2",userptr);
    glad_vkGetDescriptorSetLayoutSupport =
         (PFN_vkGetDescriptorSetLayoutSupport)(*load)("vkGetDescriptorSetLayoutSupport",userptr);
    glad_vkGetDeviceGroupPeerMemoryFeatures =
         (PFN_vkGetDeviceGroupPeerMemoryFeatures)
         (*load)("vkGetDeviceGroupPeerMemoryFeatures",userptr);
    glad_vkGetDeviceQueue2 = (PFN_vkGetDeviceQueue2)(*load)("vkGetDeviceQueue2",userptr);
    glad_vkGetImageMemoryRequirements2 =
         (PFN_vkGetImageMemoryRequirements2)(*load)("vkGetImageMemoryRequirements2",userptr);
    glad_vkGetImageSparseMemoryRequirements2 =
         (PFN_vkGetImageSparseMemoryRequirements2)
         (*load)("vkGetImageSparseMemoryRequirements2",userptr);
    glad_vkGetPhysicalDeviceExternalBufferProperties =
         (PFN_vkGetPhysicalDeviceExternalBufferProperties)
         (*load)("vkGetPhysicalDeviceExternalBufferProperties",userptr);
    glad_vkGetPhysicalDeviceExternalFenceProperties =
         (PFN_vkGetPhysicalDeviceExternalFenceProperties)
         (*load)("vkGetPhysicalDeviceExternalFenceProperties",userptr);
    glad_vkGetPhysicalDeviceExternalSemaphoreProperties =
         (PFN_vkGetPhysicalDeviceExternalSemaphoreProperties)
         (*load)("vkGetPhysicalDeviceExternalSemaphoreProperties",userptr);
    glad_vkGetPhysicalDeviceFeatures2 =
         (PFN_vkGetPhysicalDeviceFeatures2)(*load)("vkGetPhysicalDeviceFeatures2",userptr);
    glad_vkGetPhysicalDeviceFormatProperties2 =
         (PFN_vkGetPhysicalDeviceFormatProperties2)
         (*load)("vkGetPhysicalDeviceFormatProperties2",userptr);
    glad_vkGetPhysicalDeviceImageFormatProperties2 =
         (PFN_vkGetPhysicalDeviceImageFormatProperties2)
         (*load)("vkGetPhysicalDeviceImageFormatProperties2",userptr);
    glad_vkGetPhysicalDeviceMemoryProperties2 =
         (PFN_vkGetPhysicalDeviceMemoryProperties2)
         (*load)("vkGetPhysicalDeviceMemoryProperties2",userptr);
    glad_vkGetPhysicalDeviceProperties2 =
         (PFN_vkGetPhysicalDeviceProperties2)(*load)("vkGetPhysicalDeviceProperties2",userptr);
    glad_vkGetPhysicalDeviceQueueFamilyProperties2 =
         (PFN_vkGetPhysicalDeviceQueueFamilyProperties2)
         (*load)("vkGetPhysicalDeviceQueueFamilyProperties2",userptr);
    glad_vkGetPhysicalDeviceSparseImageFormatProperties2 =
         (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2)
         (*load)("vkGetPhysicalDeviceSparseImageFormatProperties2",userptr);
    glad_vkTrimCommandPool = (PFN_vkTrimCommandPool)(*load)("vkTrimCommandPool",userptr);
    glad_vkUpdateDescriptorSetWithTemplate =
         (PFN_vkUpdateDescriptorSetWithTemplate)(*load)("vkUpdateDescriptorSetWithTemplate",userptr)
    ;
  }
  instance_extension_count = 0;
  device_extension_count = 0;
  if (glad_vkEnumerateInstanceExtensionProperties == (PFN_vkEnumerateInstanceExtensionProperties)0x0
     ) {
    return 0;
  }
  if ((physical_device != (VkPhysicalDevice)0x0) &&
     (glad_vkEnumerateDeviceExtensionProperties == (PFN_vkEnumerateDeviceExtensionProperties)0x0)) {
    return 0;
  }
  uVar8 = 0;
  VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,&instance_extension_count,(VkExtensionProperties *)0x0);
  if (VVar1 != VK_SUCCESS) {
    return 0;
  }
  if (physical_device != (VkPhysicalDevice)0x0) {
    VVar1 = (*glad_vkEnumerateDeviceExtensionProperties)
                      (physical_device,(char *)0x0,&device_extension_count,
                       (VkExtensionProperties *)0x0);
    if (VVar1 != VK_SUCCESS) {
      return 0;
    }
    uVar8 = (ulong)device_extension_count;
  }
  uVar2 = (uint)uVar8;
  local_394 = instance_extension_count;
  if (uVar2 < instance_extension_count) {
    uVar8 = (ulong)instance_extension_count;
  }
  local_390 = (VkExtensionProperties *)malloc(uVar8 * 0x104);
  if (local_390 == (VkExtensionProperties *)0x0) {
    return 0;
  }
  VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,&instance_extension_count,local_390);
  pVVar7 = local_390;
  if (VVar1 == VK_SUCCESS) {
    local_394 = local_394 + uVar2;
    local_370 = (ulong)local_394;
    local_3a0 = (VkExtensionProperties *)calloc(local_370,8);
    pVVar7 = local_390;
    if (local_3a0 != (VkExtensionProperties *)0x0) {
      local_388 = (ulong)instance_extension_count;
      local_380 = physical_device;
      local_374 = iVar6;
      for (uVar8 = 0; uVar9 = local_370, local_388 != uVar8; uVar8 = uVar8 + 1) {
        memcpy(&version,pVVar7,0x104);
        sVar3 = strlen((char *)&version);
        pvVar4 = malloc(sVar3 + 1);
        *(void **)(local_3a0->extensionName + uVar8 * 8) = pvVar4;
        memcpy(pvVar4,&version,sVar3 + 1);
        pVVar7 = pVVar7 + 1;
      }
      if (local_380 != (VkPhysicalDevice)0x0) {
        VVar1 = (*glad_vkEnumerateDeviceExtensionProperties)
                          (local_380,(char *)0x0,&device_extension_count,local_390);
        if (VVar1 != VK_SUCCESS) {
          for (uVar8 = 0; pVVar7 = local_3a0, uVar8 < instance_extension_count; uVar8 = uVar8 + 1) {
            free(*(void **)(local_3a0->extensionName + uVar8 * 8));
          }
          goto LAB_0011f188;
        }
        local_388 = CONCAT44(local_388._4_4_,instance_extension_count);
        local_380 = (VkPhysicalDevice)((ulong)device_extension_count * 0x104);
        for (pVVar10 = (VkPhysicalDevice)0x0; local_380 != pVVar10; pVVar10 = pVVar10 + 0x104) {
          memcpy(&version,pVVar10 + (long)local_390->extensionName,0x104);
          sVar3 = strlen((char *)&version);
          pvVar4 = malloc(sVar3 + 1);
          uVar9 = local_370;
          iVar6 = (int)local_388;
          *(void **)(local_3a0->extensionName + (local_388 & 0xffffffff) * 8) = pvVar4;
          memcpy(pvVar4,&version,sVar3 + 1);
          local_388 = CONCAT44(local_388._4_4_,iVar6 + 1);
        }
      }
      free(local_390);
      uVar2 = local_394;
      pVVar7 = local_3a0;
      GLAD_VK_EXT_debug_report =
           glad_vk_has_extension("VK_EXT_debug_report",local_394,(char **)local_3a0);
      GLAD_VK_KHR_surface = glad_vk_has_extension("VK_KHR_surface",uVar2,(char **)pVVar7);
      GLAD_VK_KHR_swapchain = glad_vk_has_extension("VK_KHR_swapchain",uVar2,(char **)pVVar7);
      iVar6 = local_374;
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        free(*(void **)(local_3a0->extensionName + uVar8 * 8));
      }
      free(local_3a0);
      if (GLAD_VK_EXT_debug_report != 0) {
        glad_vkCreateDebugReportCallbackEXT =
             (PFN_vkCreateDebugReportCallbackEXT)(*load)("vkCreateDebugReportCallbackEXT",userptr);
        glad_vkDebugReportMessageEXT =
             (PFN_vkDebugReportMessageEXT)(*load)("vkDebugReportMessageEXT",userptr);
        glad_vkDestroyDebugReportCallbackEXT =
             (PFN_vkDestroyDebugReportCallbackEXT)(*load)("vkDestroyDebugReportCallbackEXT",userptr)
        ;
      }
      if (GLAD_VK_KHR_surface != 0) {
        glad_vkDestroySurfaceKHR = (PFN_vkDestroySurfaceKHR)(*load)("vkDestroySurfaceKHR",userptr);
        glad_vkGetPhysicalDeviceSurfaceCapabilitiesKHR =
             (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
             (*load)("vkGetPhysicalDeviceSurfaceCapabilitiesKHR",userptr);
        glad_vkGetPhysicalDeviceSurfaceFormatsKHR =
             (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)
             (*load)("vkGetPhysicalDeviceSurfaceFormatsKHR",userptr);
        glad_vkGetPhysicalDeviceSurfacePresentModesKHR =
             (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)
             (*load)("vkGetPhysicalDeviceSurfacePresentModesKHR",userptr);
        glad_vkGetPhysicalDeviceSurfaceSupportKHR =
             (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)
             (*load)("vkGetPhysicalDeviceSurfaceSupportKHR",userptr);
      }
      if (GLAD_VK_KHR_swapchain == 0) {
        return iVar6;
      }
      glad_vkAcquireNextImage2KHR =
           (PFN_vkAcquireNextImage2KHR)(*load)("vkAcquireNextImage2KHR",userptr);
      glad_vkAcquireNextImageKHR =
           (PFN_vkAcquireNextImageKHR)(*load)("vkAcquireNextImageKHR",userptr);
      glad_vkCreateSwapchainKHR = (PFN_vkCreateSwapchainKHR)(*load)("vkCreateSwapchainKHR",userptr);
      glad_vkDestroySwapchainKHR =
           (PFN_vkDestroySwapchainKHR)(*load)("vkDestroySwapchainKHR",userptr);
      glad_vkGetDeviceGroupPresentCapabilitiesKHR =
           (PFN_vkGetDeviceGroupPresentCapabilitiesKHR)
           (*load)("vkGetDeviceGroupPresentCapabilitiesKHR",userptr);
      glad_vkGetDeviceGroupSurfacePresentModesKHR =
           (PFN_vkGetDeviceGroupSurfacePresentModesKHR)
           (*load)("vkGetDeviceGroupSurfacePresentModesKHR",userptr);
      glad_vkGetPhysicalDevicePresentRectanglesKHR =
           (PFN_vkGetPhysicalDevicePresentRectanglesKHR)
           (*load)("vkGetPhysicalDevicePresentRectanglesKHR",userptr);
      glad_vkGetSwapchainImagesKHR =
           (PFN_vkGetSwapchainImagesKHR)(*load)("vkGetSwapchainImagesKHR",userptr);
      glad_vkQueuePresentKHR = (PFN_vkQueuePresentKHR)(*load)("vkQueuePresentKHR",userptr);
      return iVar6;
    }
  }
LAB_0011f188:
  free(pVVar7);
  return 0;
}

Assistant:

int gladLoadVulkanUserPtr( VkPhysicalDevice physical_device, GLADuserptrloadfunc load, void *userptr) {
    int version;

#ifdef VK_VERSION_1_1
    vkEnumerateInstanceVersion  = (PFN_vkEnumerateInstanceVersion) load("vkEnumerateInstanceVersion", userptr);
#endif
    version = glad_vk_find_core_vulkan( physical_device);
    if (!version) {
        return 0;
    }

    glad_vk_load_VK_VERSION_1_0(load, userptr);
    glad_vk_load_VK_VERSION_1_1(load, userptr);

    if (!glad_vk_find_extensions_vulkan( physical_device)) return 0;
    glad_vk_load_VK_EXT_debug_report(load, userptr);
    glad_vk_load_VK_KHR_surface(load, userptr);
    glad_vk_load_VK_KHR_swapchain(load, userptr);


    return version;
}